

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O1

string * __thiscall
kws::Parser::FindMemberFunction
          (string *__return_storage_ptr__,Parser *this,string *buffer,size_t start,size_t end,
          size_t *pos)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ulong pos_00;
  long lVar4;
  size_t pos_01;
  bool bVar5;
  ulong uVar6;
  size_t pos_02;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  string functionLine;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Parser *local_98;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pos_00 = std::__cxx11::string::find((char *)buffer,0x177d56,start);
  if (pos_00 < end) {
    do {
      lVar4 = GetLineNumber(this,pos_00,true);
      GetLine_abi_cxx11_(&local_90,this,lVar4 - 1);
      lVar4 = std::__cxx11::string::find((char *)&local_90,0x178e5e,0);
      if ((lVar4 == -1) &&
         (lVar4 = std::__cxx11::string::find((char *)&local_90,0x178e6a,0), lVar4 == -1)) {
        if (pos_00 == 0) {
          pos_02 = 0xffffffffffffffff;
        }
        else {
          bVar8 = true;
          pos_02 = pos_00;
          do {
            pos_02 = pos_02 - 1;
            if ((pos_02 < start) || (!bVar8)) goto LAB_0015b845;
            if ((buffer->_M_dataplus)._M_p[pos_02] == ')') {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
              pos_01 = FindClosingChar(this,')','(',pos_02,true,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if (pos_01 == 0) {
LAB_0015b80b:
                bVar9 = true;
                pos_01 = pos_02;
                bVar5 = bVar8;
              }
              else {
                bVar2 = IsInFunction(this,pos_01,(buffer->_M_dataplus)._M_p);
                bVar9 = false;
                bVar5 = false;
                if (bVar2) goto LAB_0015b80b;
              }
              pos_02 = pos_01;
              bVar8 = bVar5;
              if (!bVar9) goto LAB_0015b845;
            }
          } while (pos_02 != 0);
          pos_02 = 0xffffffffffffffff;
        }
LAB_0015b845:
        uVar7 = pos_02 - 1;
        *pos = uVar7;
        if (end <= uVar7 || uVar7 <= start) goto LAB_0015bb00;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        uVar7 = *pos;
        if (start < uVar7 && uVar7 != 0xffffffffffffffff) {
          bVar8 = false;
          local_98 = this;
          do {
            pcVar1 = (buffer->_M_dataplus)._M_p;
            uVar6 = (ulong)(byte)pcVar1[uVar7];
            if ((uVar6 < 0x2b) && ((0x44100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
              if (bVar8) break;
            }
            else {
              std::operator+(&local_b8,pcVar1[uVar7],__return_storage_ptr__);
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              bVar8 = true;
              this = local_98;
            }
            uVar7 = uVar7 - 1;
          } while (start < uVar7);
        }
        lVar4 = GetLineNumber(this,pos_02,true);
        GetLine_abi_cxx11_(&local_b8,this,lVar4 - 1);
        bVar8 = false;
        lVar4 = std::__cxx11::string::find((char *)&local_b8,0x1782ba,0);
        bVar9 = true;
        if (lVar4 == -1) {
          bVar8 = false;
          lVar4 = std::__cxx11::string::find((char *)&local_b8,0x178e5e,0);
          if (lVar4 == -1) {
            bVar8 = false;
            lVar4 = std::__cxx11::string::find((char *)&local_b8,0x178e6a,0);
            if (lVar4 == -1) {
              bVar8 = false;
              lVar4 = std::__cxx11::string::find((char *)&local_b8,0x178e74,0);
              if (lVar4 == -1) {
                lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x177d62,0);
                if (lVar4 != -1) {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
                  std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)local_50);
                  if (local_50[0] != local_40) {
                    operator_delete(local_50[0]);
                  }
                }
                lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x178e53,0);
                if (lVar4 != -1) {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
                  std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)local_50);
                  if (local_50[0] != local_40) {
                    operator_delete(local_50[0]);
                  }
                }
                iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
                bVar9 = iVar3 == 0;
                bVar8 = !bVar9;
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((!bVar8) &&
           (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar1 != &__return_storage_ptr__->field_2)) {
          operator_delete(pcVar1);
        }
        bVar8 = true;
        if (bVar9) goto LAB_0015bb00;
      }
      else {
LAB_0015bb00:
        bVar8 = false;
        pos_00 = std::__cxx11::string::find((char *)buffer,0x177d56,pos_00 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar8) {
        return __return_storage_ptr__;
      }
    } while (pos_00 < end);
  }
  *pos = 0xffffffffffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindMemberFunction(std::string & buffer, size_t start, size_t end,size_t& pos)
{
  size_t posSemicolon = buffer.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We check that we don't have the keyword __attribute__
    std::string line = this->GetLine(this->GetLineNumber(posSemicolon,true)-1);
    if((line.find("_attribute_") != std::string::npos)
      || (line.find(" operator") != std::string::npos)
      )
      {
      posSemicolon = buffer.find(";",posSemicolon+1);
      continue;
      }

    // We try to find a (
    size_t i=posSemicolon-1;
    bool inFunction = true;
    while(i != std::string::npos && i>=start && inFunction)
      {
      if(buffer[i] == ')')
        {
        size_t close = this->FindClosingChar(')','(',i,true);
        if(close>0 && !this->IsInFunction(close,buffer.c_str()))
          {
          i = close;
          inFunction = false;
          break;
          }
        }
      i--;
      }

    pos = i-1;

    // If we have a match we extract the word
    if(pos != std::string::npos && pos>start && pos<end)
      {
      std::string functionName = "";
      bool inWord = false;
      size_t index=pos;
      for(;index!=std::string::npos && index>start;index--)
        {
        if(buffer[index] != ' ' && buffer[index] != '\t'
           && buffer[index] != '\r' && buffer[index] != '\n' && buffer[index] != '*' && buffer[index] != '&')
          {
          inWord = true;
          functionName = buffer[index]+functionName;
          }
        else if(inWord)
          {
          break;
          }
        }
      // Check that this is not a #define (tricky)
      std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);
      if(functionLine.find("#define") == std::string::npos
         && functionLine.find("_attribute_") == std::string::npos
         && functionLine.find(" operator") == std::string::npos
         && functionLine.find("friend ") == std::string::npos)
        {
        // If we have a class definition: Test():Base
        // we return the correct
        size_t posf = functionName.find("(",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }
        posf = functionName.find(":",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }

        // If the function name is void we skip because it means
        // this is a member variable function (see bug 5086)
        if(functionName != "void")
          {
          return functionName;
          }
        }
      }
    posSemicolon = buffer.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}